

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

int vrna_nucleotide_IUPAC_identity(char nt,char mask)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *local_18;
  char *p;
  char n2;
  char n1;
  char mask_local;
  char nt_local;
  
  local_18 = (char *)0x0;
  iVar2 = toupper((int)nt);
  iVar3 = toupper((int)mask);
  cVar1 = (char)iVar3;
  uVar4 = (int)(char)iVar2 - 0x41;
  if (uVar4 < 0x18 || (char)iVar2 == 0x59) {
    switch((long)&switchD_00151e4c::switchdataD_00307420 +
           (long)(int)(&switchD_00151e4c::switchdataD_00307420)[uVar4]) {
    case 0x151e4e:
      local_18 = strchr("ARMWDHVN",(int)cVar1);
      break;
    case 0x151e67:
      local_18 = strchr("CYMSBHVN",(int)cVar1);
      break;
    case 0x151e80:
      local_18 = strchr("GRKSBDVN",(int)cVar1);
      break;
    case 0x151e99:
      local_18 = strchr("TYKWBDHN",(int)cVar1);
      break;
    case 0x151eb2:
      local_18 = strchr("UYKWBDHN",(int)cVar1);
      break;
    case 0x151ecb:
      local_18 = strchr("IN",(int)cVar1);
      break;
    case 0x151ee4:
      local_18 = strchr("AGR",(int)cVar1);
      break;
    case 0x151efd:
      local_18 = strchr("CTUY",(int)cVar1);
      break;
    case 0x151f16:
      local_18 = strchr("GTUK",(int)cVar1);
      break;
    case 0x151f2f:
      local_18 = strchr("ACM",(int)cVar1);
      break;
    case 0x151f48:
      local_18 = strchr("GCS",(int)cVar1);
      break;
    case 0x151f61:
      local_18 = strchr("ATUW",(int)cVar1);
      break;
    case 0x151f77:
      local_18 = strchr("GCTBU",(int)cVar1);
      break;
    case 0x151f8d:
      local_18 = strchr("AGTUD",(int)cVar1);
      break;
    case 0x151fa3:
      local_18 = strchr("ACTUH",(int)cVar1);
      break;
    case 0x151fb9:
      local_18 = strchr("ACGV",(int)cVar1);
      break;
    case 0x151fcf:
      local_18 = strchr("ACGTUN",(int)cVar1);
    }
  }
  return (uint)(local_18 != (char *)0x0);
}

Assistant:

PUBLIC int
vrna_nucleotide_IUPAC_identity(char nt,
                               char mask)
{
  char n1, n2, *p;

  p   = NULL;
  n1  = toupper(nt);
  n2  = toupper(mask);

  switch (n1) {
    case 'A':
      p = strchr("ARMWDHVN", n2);
      break;
    case 'C':
      p = strchr("CYMSBHVN", n2);
      break;
    case 'G':
      p = strchr("GRKSBDVN", n2);
      break;
    case 'T':
      p = strchr("TYKWBDHN", n2);
      break;
    case 'U':
      p = strchr("UYKWBDHN", n2);
      break;
    case 'I':
      p = strchr("IN", n2);
      break;
    case 'R':
      p = strchr("AGR", n2);
      break;
    case 'Y':
      p = strchr("CTUY", n2);
      break;
    case 'K':
      p = strchr("GTUK", n2);
      break;
    case 'M':
      p = strchr("ACM", n2);
      break;
    case 'S':
      p = strchr("GCS", n2);
      break;
    case 'W':
      p = strchr("ATUW", n2);
      break;
    case 'B':
      p = strchr("GCTBU", n2);
      break;
    case 'D':
      p = strchr("AGTUD", n2);
      break;
    case 'H':
      p = strchr("ACTUH", n2);
      break;
    case 'V':
      p = strchr("ACGV", n2);
      break;
    case 'N':
      p = strchr("ACGTUN", n2);
      break;
  }

  return (p) ? 1 : 0;
}